

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void close_frame_written(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  
  puVar5 = *(undefined8 **)((long)handler_context + 0x218);
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = (undefined8 *)0x0;
  }
  else {
    if (puVar5 == *(undefined8 **)((long)handler_context + 0x220)) {
      uVar4 = 0;
    }
    else {
      uVar4 = *puVar5;
    }
    *(undefined8 *)((long)handler_context + 0x218) = uVar4;
  }
  plVar1 = (long *)puVar5[1];
  plVar2 = (long *)*plVar1;
  if (plVar2 != (long *)0x0 && plVar2 != plVar1) {
    plVar1[2] = plVar1[2] + -1;
    plVar1[3] = plVar1[3] - plVar2[3];
    lVar3 = *plVar2;
    plVar1 = (long *)plVar2[1];
    *(long **)(lVar3 + 8) = plVar1;
    *plVar1 = lVar3;
  }
  puVar5[1] = 0;
  abort_write_jobs((cio_websocket *)handler_context);
  if ((code *)puVar5[8] != (code *)0x0) {
    (*(code *)puVar5[8])(handler_context,puVar5[9],err);
    return;
  }
  return;
}

Assistant:

static void close_frame_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	const struct cio_websocket_write_job *job = write_jobs_popfront(websocket);

	abort_write_jobs(websocket);

	if (job->handler) {
		job->handler(websocket, job->handler_context, err);
	}
}